

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBaseRunner.cpp
# Opt level: O2

void __thiscall
xmrig::OclBaseRunner::OclBaseRunner(OclBaseRunner *this,size_t id,OclLaunchData *data)

{
  string *psVar1;
  cl_uint cVar2;
  char *pcVar3;
  String local_30;
  
  (this->super_IOclRunner)._vptr_IOclRunner = (_func_int **)&PTR__OclBaseRunner_001bc200;
  this->m_queue = (cl_command_queue)0x0;
  this->m_ctx = data->ctx;
  this->m_buffer = (cl_mem)0x0;
  this->m_input = (cl_mem)0x0;
  this->m_output = (cl_mem)0x0;
  this->m_program = (cl_program)0x0;
  pcVar3 = OclSource::get();
  this->m_source = pcVar3;
  this->m_data = data;
  cVar2 = OclLib::getUint((data->device).m_id,0x1019,0);
  this->m_align = (ulong)cVar2;
  this->m_threadId = id;
  this->m_intensity = (data->thread).m_intensity;
  this->m_offset = 0;
  (this->m_deviceKey)._M_dataplus._M_p = (pointer)&(this->m_deviceKey).field_2;
  (this->m_deviceKey)._M_string_length = 0;
  (this->m_deviceKey).field_2._M_local_buf[0] = '\0';
  (this->m_options)._M_dataplus._M_p = (pointer)&(this->m_options).field_2;
  (this->m_options)._M_string_length = 0;
  psVar1 = &this->m_deviceKey;
  (this->m_options).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  OclPlatform::version((OclPlatform *)&local_30);
  std::__cxx11::string::append((char *)psVar1);
  String::~String(&local_30);
  std::__cxx11::string::append((char *)psVar1);
  OclLib::getString((OclLib *)&local_30,(data->device).m_id,0x102d);
  std::__cxx11::string::append((char *)psVar1);
  String::~String(&local_30);
  std::__cxx11::string::append((char *)psVar1);
  return;
}

Assistant:

xmrig::OclBaseRunner::OclBaseRunner(size_t id, const OclLaunchData &data) :
    m_ctx(data.ctx),
    m_source(OclSource::get()),
    m_data(data),
    m_align(OclLib::getUint(data.device.id(), CL_DEVICE_MEM_BASE_ADDR_ALIGN)),
    m_threadId(id),
    m_intensity(data.thread.intensity())
{
    m_deviceKey = data.device.name();

#   ifdef XMRIG_STRICT_OPENCL_CACHE
    m_deviceKey += ":";
    m_deviceKey += data.platform.version();

    m_deviceKey += ":";
    m_deviceKey += OclLib::getString(data.device.id(), CL_DRIVER_VERSION);
#   endif

#   if defined(__x86_64__) || defined(_M_AMD64) || defined (__arm64__) || defined (__aarch64__)
    m_deviceKey += ":64";
#   endif
}